

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<void_const*,QCss::StyleSheet>>::findOrInsert<void_const*>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<void_const*,QCss::StyleSheet>> *this,void **key)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  Bucket BVar4;
  
  uVar3 = ((*(ulong *)(this + 0x18) ^ (ulong)*key) >> 0x20 ^ *(ulong *)(this + 0x18) ^ (ulong)*key)
          * -0x2917014799a6026d;
  uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  uVar3 = uVar3 >> 0x20 ^ uVar3;
  if (*(long *)(this + 0x10) == 0) {
    BVar4 = (Bucket)ZEXT816(0);
  }
  else {
    BVar4 = findBucketWithHash<void_const*>(this,key,uVar3);
    bVar2 = true;
    if ((BVar4.span)->offsets[BVar4.index] != 0xff) goto LAB_00379ae4;
  }
  if (*(ulong *)(this + 0x10) >> 1 <= *(ulong *)(this + 8)) {
    Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::rehash
              ((Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)this,
               *(ulong *)(this + 8) + 1);
    BVar4 = findBucketWithHash<void_const*>(this,key,uVar3);
  }
  Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::insert(BVar4.span,BVar4.index);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  bVar2 = false;
LAB_00379ae4:
  lVar1 = *(long *)(this + 0x20);
  (__return_storage_ptr__->it).d = (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)this
  ;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar4.span - lVar1) >> 4) * 0x1c71c71c71c71c80 | BVar4.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }